

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001c37c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001c37c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c37b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c37b8 = 0x2d2d2d2d2d2d2d;
    DAT_001c37bf = 0x2d;
    _DAT_001c37a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c37a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001c3790 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c3798 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001c3788 = 0x2d2d2d2d2d2d2d2d;
    DAT_001c37cf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }